

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

int32_t icu_63::UCharsTrie::readValue(char16_t *pos,int32_t leadUnit)

{
  uint local_18;
  int32_t value;
  int32_t leadUnit_local;
  char16_t *pos_local;
  
  local_18 = leadUnit;
  if (0x3fff < leadUnit) {
    if (leadUnit < 0x7fff) {
      local_18 = (leadUnit + -0x4000) * 0x10000 | (uint)(ushort)*pos;
    }
    else {
      local_18 = CONCAT22(*pos,pos[1]);
    }
  }
  return local_18;
}

Assistant:

static inline int32_t readValue(const char16_t *pos, int32_t leadUnit) {
        int32_t value;
        if(leadUnit<kMinTwoUnitValueLead) {
            value=leadUnit;
        } else if(leadUnit<kThreeUnitValueLead) {
            value=((leadUnit-kMinTwoUnitValueLead)<<16)|*pos;
        } else {
            value=(pos[0]<<16)|pos[1];
        }
        return value;
    }